

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds01_pair_sum.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  long lVar2;
  mapped_type *pmVar3;
  long lVar4;
  char *__s;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  key_type *__k;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mi;
  int local_3c;
  uint local_38;
  int tgt;
  int n;
  
  uStack_80 = 0x101219;
  __isoc99_scanf("%d%d",&local_38,&tgt);
  lVar2 = -((ulong)local_38 * 4 + 0xf & 0xfffffffffffffff0);
  mi._M_t._M_impl._0_4_ = 0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mi;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&mi;
  mi._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_78;
  iVar5 = tgt;
  if (0 < (int)local_38) {
    lVar4 = 0;
    __k = (key_type *)(local_78 + lVar2);
    mi._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_78;
    do {
      *(undefined8 *)(local_78 + lVar2 + -8) = 0x10126e;
      __isoc99_scanf("%d",__k);
      *(undefined8 *)(local_78 + lVar2 + -8) = 0x101279;
      pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_78,__k);
      *pmVar3 = *pmVar3 + 1;
      lVar4 = lVar4 + 1;
      __k = __k + 1;
      iVar5 = tgt;
    } while (lVar4 < (int)local_38);
  }
  do {
    tgt = iVar5 + -1;
    if (iVar5 == 0) {
      *(undefined8 *)(local_78 + lVar2 + -8) = 0x1013a6;
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_78);
      return 0;
    }
    *(undefined8 *)(local_78 + lVar2 + -8) = 0x1012ad;
    __isoc99_scanf("%d");
    if (0 < (long)(int)local_38) {
      lVar4 = 0;
      do {
        iVar5 = *(int *)((long)(local_78 + lVar2) + lVar4 * 4);
        if (iVar5 * 2 == local_3c) {
          p_Var9 = (_Base_ptr)&mi;
          p_Var10 = (_Base_ptr)&mi;
          p_Var7 = (_Base_ptr)mi._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          if (mi._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
            do {
              p_Var6 = p_Var7;
              p_Var8 = p_Var9;
              iVar1 = p_Var6[1]._M_color;
              p_Var9 = p_Var6;
              if (iVar1 < iVar5) {
                p_Var9 = p_Var8;
              }
              p_Var7 = (&p_Var6->_M_left)[iVar1 < iVar5];
            } while ((&p_Var6->_M_left)[iVar1 < iVar5] != (_Base_ptr)0x0);
            if (p_Var9 != (_Base_ptr)&mi) {
              if (iVar1 < iVar5) {
                p_Var6 = p_Var8;
              }
              p_Var10 = p_Var9;
              if (iVar5 < (int)p_Var6[1]._M_color) {
                p_Var10 = (_Base_ptr)&mi;
              }
            }
          }
          if (1 < *(int *)&p_Var10[1].field_0x4) {
LAB_00101387:
            __s = "YES";
            goto LAB_0010138e;
          }
        }
        else if (mi._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
          iVar5 = local_3c - iVar5;
          p_Var9 = (_Base_ptr)&mi;
          p_Var10 = (_Base_ptr)mi._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          do {
            p_Var7 = p_Var10;
            p_Var6 = p_Var9;
            iVar1 = p_Var7[1]._M_color;
            p_Var9 = p_Var7;
            if (iVar1 < iVar5) {
              p_Var9 = p_Var6;
            }
            p_Var10 = (&p_Var7->_M_left)[iVar1 < iVar5];
          } while ((&p_Var7->_M_left)[iVar1 < iVar5] != (_Base_ptr)0x0);
          if (p_Var9 != (_Base_ptr)&mi) {
            if (iVar1 < iVar5) {
              p_Var7 = p_Var6;
            }
            if ((int)p_Var7[1]._M_color <= iVar5) goto LAB_00101387;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != (int)local_38);
    }
    __s = "NO";
LAB_0010138e:
    *(undefined8 *)(local_78 + lVar2 + -8) = 0x101393;
    puts(__s);
    iVar5 = tgt;
  } while( true );
}

Assistant:

int main() {
    int n, m;
    scanf("%d%d", &n, &m);
    int arr[n];
    map<int, int> mi;
    for (int i = 0; i < n; ++i) {
        scanf("%d", &arr[i]);
        mi[arr[i]]++;
    }
wl:
    while (m--) {
        int tgt;
        scanf("%d", &tgt);
        for (int i = 0; i < n; ++i) {
            if (2 * arr[i] == tgt) {
                if (mi.find(arr[i])->second > 1) {
                    printf("YES\n");
                    goto wl;
                }
            } else if (mi.find(tgt - arr[i]) != mi.end()) {
                printf("YES\n");
                goto wl;
            }
        }
        printf("NO\n");
    }
}